

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O1

void __thiscall ON_OutlineAccumulator::Clear(ON_OutlineAccumulator *this)

{
  void *pvVar1;
  undefined8 *puVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ON_2dex OVar8;
  ON_2dex OVar9;
  ON_2dex OVar10;
  
  pvVar1 = *(void **)(this + 0x58);
  if (pvVar1 != (void *)0x0) {
    if (*(void **)(this + 0x50) == pvVar1) {
      *(undefined8 *)(this + 0x50) = 0;
    }
    ON_ClassArray<ON_OutlineFigure>::~ON_ClassArray
              ((ON_ClassArray<ON_OutlineFigure> *)((long)pvVar1 + 0x60));
    operator_delete(pvVar1,0x78);
    *(undefined8 *)(this + 0x58) = 0;
  }
  dVar3 = ON_Outline::Unset.m_short_tolerance;
  puVar2 = *(undefined8 **)(this + 0x50);
  if (puVar2 != (undefined8 *)0x0) {
    *puVar2 = ON_Outline::Unset._0_8_;
    puVar2[1] = dVar3;
    dVar7 = ON_Outline::Unset.m_bbox.m_max.z;
    dVar6 = ON_Outline::Unset.m_bbox.m_max.y;
    dVar5 = ON_Outline::Unset.m_bbox.m_max.x;
    dVar4 = ON_Outline::Unset.m_bbox.m_min.z;
    dVar3 = ON_Outline::Unset.m_bbox.m_min.y;
    puVar2[2] = ON_Outline::Unset.m_bbox.m_min.x;
    puVar2[3] = dVar3;
    puVar2[4] = dVar4;
    puVar2[5] = dVar5;
    puVar2[6] = dVar6;
    puVar2[7] = dVar7;
    OVar10 = ON_Outline::Unset.m_glyph_metrics.m_advance;
    OVar9 = ON_Outline::Unset.m_glyph_metrics.m_max_basepoint;
    OVar8 = ON_Outline::Unset.m_glyph_metrics.m_bbmax;
    *(ON_2dex *)(puVar2 + 8) = ON_Outline::Unset.m_glyph_metrics.m_bbmin;
    *(ON_2dex *)(puVar2 + 9) = OVar8;
    *(ON_2dex *)(puVar2 + 10) = OVar9;
    *(ON_2dex *)(puVar2 + 0xb) = OVar10;
    ON_ClassArray<ON_OutlineFigure>::operator=
              ((ON_ClassArray<ON_OutlineFigure> *)(puVar2 + 0xc),&ON_Outline::Unset.m_figures);
  }
  *(undefined4 *)this = 0;
  *(undefined2 *)(this + 4) = 0;
  *(undefined8 *)(this + 8) = 0;
  if (-1 < *(int *)(this + 0x4c)) {
    *(undefined4 *)(this + 0x48) = 0;
  }
  *(float *)(this + 0x18) = ON_OutlineFigurePoint::Unset.m_point.y;
  *(undefined8 *)(this + 0x10) = ON_OutlineFigurePoint::Unset._0_8_;
  *(undefined8 *)(this + 0x1c) = ON_OutlineFigurePoint::Unset._0_8_;
  *(float *)(this + 0x24) = ON_OutlineFigurePoint::Unset.m_point.y;
  *(undefined8 *)(this + 0x28) = ON_OutlineFigurePoint::Unset._0_8_;
  *(float *)(this + 0x30) = ON_OutlineFigurePoint::Unset.m_point.y;
  return;
}

Assistant:

void ON_OutlineAccumulator::Clear()
{
  if (m_managed_outline)
  {
    if (m_outline == m_managed_outline)
      m_outline = nullptr;
    delete m_managed_outline;
    m_managed_outline = nullptr;
  }

  if ( nullptr != m_outline)
    *m_outline = ON_Outline::Unset;

  m_units_per_em = 0;
  m_status = 0;
  m_figure_type = ON_OutlineFigure::Type::Unset;
  m_figure_depth = 0;
  m_error_count = 0;

  AbandonCurrentFigure();
}